

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void Rml::Log::ParseError(String *filename,int line_number,char *fmt,...)

{
  pointer pcVar1;
  uint uVar2;
  char in_AL;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argument_list;
  char buffer [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [24];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1032];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e0 = &argument_list[0].overflow_arg_area;
  local_4e8 = 0x3000000018;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  uVar3 = vsnprintf(local_418,0x3fe,fmt,&local_4e8);
  uVar2 = 0x3fe;
  if (uVar3 < 0x3fe) {
    uVar2 = uVar3;
  }
  local_418[uVar2] = '\0';
  pcVar1 = (filename->_M_dataplus)._M_p;
  if (line_number < 0) {
    Message(LT_ERROR,"%s: %s",pcVar1,local_418);
  }
  else {
    Message(LT_ERROR,"%s:%d: %s",pcVar1,line_number,local_418);
  }
  return;
}

Assistant:

void Log::ParseError(const String& filename, int line_number, const char* fmt, ...)
{
	const int buffer_size = 1024;
	char buffer[buffer_size];
	va_list argument_list;

	// Print the message to the buffer.
	va_start(argument_list, fmt);
	int len = vsnprintf(buffer, buffer_size - 2, fmt, argument_list);
	if (len < 0 || len > buffer_size - 2)
	{
		len = buffer_size - 2;
	}
	buffer[len] = '\0';
	va_end(argument_list);

	if (line_number >= 0)
		Message(Log::LT_ERROR, "%s:%d: %s", filename.c_str(), line_number, buffer);
	else
		Message(Log::LT_ERROR, "%s: %s", filename.c_str(), buffer);
}